

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnp.c++
# Opt level: O2

void __thiscall
capnp::compiler::CompilerMain::ParseErrorCatcher::~ParseErrorCatcher(ParseErrorCatcher *this)

{
  size_t sVar1;
  ProcessContext *pPVar2;
  bool bVar3;
  char (*params_7) [19];
  int local_44;
  Array<char> local_40;
  char *local_28;
  char *local_20;
  long local_18;
  
  (this->super_ExceptionCallback)._vptr_ExceptionCallback =
       (_func_int **)&PTR__ParseErrorCatcher_00272b28;
  params_7 = (char (*) [19])0x120a38;
  bVar3 = kj::UnwindDetector::isUnwinding(&this->unwindDetector);
  if ((!bVar3) && ((this->exception).ptr.isSet == true)) {
    sVar1 = (this->exception).ptr.field_1.value.description.content.size_;
    if (sVar1 == 0) {
      local_20 = "";
    }
    else {
      local_20 = (this->exception).ptr.field_1.value.description.content.ptr;
    }
    pPVar2 = this->context;
    local_18 = sVar1 + (sVar1 == 0);
    local_28 = (this->exception).ptr.field_1.value.file;
    local_44 = (this->exception).ptr.field_1.value.line;
    kj::
    str<char_const(&)[165],char_const(&)[24],kj::StringPtr,char_const(&)[17],char_const*,char_const(&)[2],int,char_const(&)[19]>
              ((String *)&local_40,
               (kj *)
               "*** ERROR CONVERTING PREVIOUS MESSAGE ***\nThe following error occurred while converting the message above.\nThis probably means the input data is invalid/corrupted.\n"
               ,(char (*) [165])"Exception description: ",(char (*) [24])&local_20,
               (StringPtr *)"\nCode location: ",(char (*) [17])&local_28,(char **)0x20c22a,
               (char (*) [2])&local_44,(int *)"\n*** END ERROR ***",params_7);
    if (local_40.size_ == 0) {
      local_40.ptr = "";
    }
    (*pPVar2->_vptr_ProcessContext[3])(pPVar2,local_40.ptr,local_40.size_ + (local_40.size_ == 0));
    kj::Array<char>::~Array(&local_40);
  }
  kj::_::NullableValue<kj::Exception>::~NullableValue(&(this->exception).ptr);
  kj::ExceptionCallback::~ExceptionCallback(&this->super_ExceptionCallback);
  return;
}

Assistant:

~ParseErrorCatcher() noexcept(false) {
      if (!unwindDetector.isUnwinding()) {
        KJ_IF_SOME(e, exception) {
          context.error(kj::str(
              "*** ERROR CONVERTING PREVIOUS MESSAGE ***\n"
              "The following error occurred while converting the message above.\n"
              "This probably means the input data is invalid/corrupted.\n",
              "Exception description: ", e.getDescription(), "\n"
              "Code location: ", e.getFile(), ":", e.getLine(), "\n"
              "*** END ERROR ***"));
        }
      }
    }